

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter_test.cpp
# Opt level: O3

void __thiscall
InterpreterTestSuite_PC_Token_Test::TestBody(InterpreterTestSuite_PC_Token_Test *this)

{
  FunctionMocker<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&()> *pFVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  undefined8 uVar5;
  element_type *peVar6;
  element_type *peVar7;
  bool bVar8;
  TypedExpectation<ot::commissioner::Error_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_short)>
  *this_00;
  TypedExpectation<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&()> *pTVar9;
  ActionInterface<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&()> *pAVar10;
  TypedExpectation<ot::commissioner::Error_(const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&)>
  *this_01;
  _func_int **message;
  char *in_R9;
  initializer_list<unsigned_char> __l;
  Value value;
  ByteArray token;
  TestContext ctx;
  _Any_data local_2e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2d8;
  Matcher<unsigned_short> local_2c8;
  undefined1 local_2b0 [8];
  undefined **local_2a8;
  undefined1 local_2a0 [8];
  undefined1 local_298 [16];
  _Alloc_hider local_288;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_280;
  element_type local_278 [2];
  string local_268;
  Expression local_248;
  ErrorCode local_228 [2];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_220;
  undefined1 local_218 [8];
  _Alloc_hider local_210;
  size_type local_208;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_200;
  _Alloc_hider local_1f0;
  size_type local_1e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1e0;
  ErrorCode local_1cc;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_1c8;
  Error local_1b0;
  Error local_188;
  TestContext local_160;
  
  InterpreterTestSuite::TestContext::TestContext(&local_160);
  InterpreterTestSuite::InitContext(&this->super_InterpreterTestSuite,&local_160);
  local_248.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_248.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_248.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_210._M_p = (pointer)&local_200;
  local_218._0_4_ = kNone;
  local_208 = 0;
  local_200._M_local_buf[0] = '\0';
  local_1f0._M_p = (pointer)&local_1e0;
  local_1e8 = 0;
  local_1e0._M_local_buf[0] = '\0';
  local_2b0._0_6_ = 0x666561333231;
  __l._M_len = 6;
  __l._M_array = local_2b0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&local_1c8,__l,(allocator_type *)&local_2e8);
  peVar7 = local_160.mDefaultCommissionerObject.
           super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_268._M_string_length = (size_type)operator_new(8);
  ((__shared_ptr<testing::internal::ExpectationBase,_(__gnu_cxx::_Lock_policy)2> *)
  &((pointer)local_268._M_string_length)->_M_dataplus)->_M_ptr =
       (element_type *)&PTR__MatcherDescriberInterface_003995b8;
  paVar2 = &local_268.field_2;
  local_268._M_dataplus._M_p = (pointer)&PTR__MatcherBase_003968b0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<testing::MatcherInterface<std::__cxx11::string_const&>const*>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&paVar2->_M_allocated_capacity,
             (MatcherInterface<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
              *)local_268._M_string_length);
  local_268._M_dataplus._M_p = (pointer)&PTR__MatcherBase_00396868;
  local_2c8.super_MatcherBase<unsigned_short>.impl_.
  super___shared_ptr<const_testing::MatcherInterface<const_unsigned_short_&>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)operator_new(8);
  ((MatcherDescriberInterface *)
  &((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
   local_2c8.super_MatcherBase<unsigned_short>.impl_.
   super___shared_ptr<const_testing::MatcherInterface<const_unsigned_short_&>,_(__gnu_cxx::_Lock_policy)2>
   ._M_ptr)->_vptr__Sp_counted_base)->_vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherDescriberInterface_00399670;
  local_2c8.super_MatcherBase<unsigned_short>._vptr_MatcherBase =
       (_func_int **)&PTR__MatcherBase_00396a78;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<testing::MatcherInterface<unsigned_short_const&>const*>
            (&local_2c8.super_MatcherBase<unsigned_short>.impl_.
              super___shared_ptr<const_testing::MatcherInterface<const_unsigned_short_&>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount,
             local_2c8.super_MatcherBase<unsigned_short>.impl_.
             super___shared_ptr<const_testing::MatcherInterface<const_unsigned_short_&>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr);
  local_2c8.super_MatcherBase<unsigned_short>._vptr_MatcherBase =
       (_func_int **)&PTR__MatcherBase_00396a30;
  CommissionerAppMock::gmock_RequestToken
            ((MockSpec<ot::commissioner::Error_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_short)>
              *)local_2b0,peVar7,
             (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
              *)&local_268,&local_2c8);
  testing::internal::GetWithoutMatchers();
  this_00 = testing::internal::
            MockSpec<ot::commissioner::Error_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_short)>
            ::InternalExpectedAt
                      ((MockSpec<ot::commissioner::Error_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_short)>
                        *)local_2b0,
                       "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
                       ,0x4b1,"*ctx.mDefaultCommissionerObject","RequestToken(_, _)");
  paVar3 = &local_188.mMessage.field_2;
  local_188.mCode = kNone;
  local_188.mMessage._M_string_length = 0;
  local_188.mMessage.field_2._M_local_buf[0] = '\0';
  local_188.mMessage._M_dataplus._M_p = (pointer)paVar3;
  testing::Return<ot::commissioner::Error>((testing *)local_228,&local_188);
  testing::internal::ReturnAction::operator_cast_to_Action
            ((Action<ot::commissioner::Error_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_short)>
              *)&local_2e8,(ReturnAction *)local_228);
  testing::internal::
  TypedExpectation<ot::commissioner::Error_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_short)>
  ::WillOnce(this_00,(Action<ot::commissioner::Error_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_short)>
                      *)&local_2e8);
  if ((pointer)local_2d8._M_allocated_capacity != (pointer)0x0) {
    (*(code *)local_2d8._M_allocated_capacity)(&local_2e8,&local_2e8,3);
  }
  if (local_220 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_220);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_188.mMessage._M_dataplus._M_p != paVar3) {
    operator_delete(local_188.mMessage._M_dataplus._M_p);
  }
  local_298._8_8_ = &PTR__MatcherBase_003968b0;
  if (local_280._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_280._M_pi);
  }
  local_2a8 = &PTR__MatcherBase_00396a78;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_298._0_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_298._0_8_);
  }
  local_2c8.super_MatcherBase<unsigned_short>._vptr_MatcherBase =
       (_func_int **)&PTR__MatcherBase_00396a78;
  if (local_2c8.super_MatcherBase<unsigned_short>.impl_.
      super___shared_ptr<const_testing::MatcherInterface<const_unsigned_short_&>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_2c8.super_MatcherBase<unsigned_short>.impl_.
               super___shared_ptr<const_testing::MatcherInterface<const_unsigned_short_&>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  local_268._M_dataplus._M_p = (pointer)&PTR__MatcherBase_003968b0;
  if ((pointer)local_268.field_2._M_allocated_capacity != (pointer)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_268.field_2._M_allocated_capacity);
  }
  pFVar1 = &(local_160.mDefaultCommissionerObject.
             super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            gmock10_GetToken_132;
  testing::internal::UntypedFunctionMockerBase::RegisterOwner
            (&pFVar1->super_UntypedFunctionMockerBase,
             local_160.mDefaultCommissionerObject.
             super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  local_2e8._M_unused._0_8_ = (undefined8)pFVar1;
  testing::internal::GetWithoutMatchers();
  pTVar9 = testing::internal::
           MockSpec<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&()>::
           InternalExpectedAt((MockSpec<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&()>
                               *)&local_2e8,
                              "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
                              ,0x4b2,"*ctx.mDefaultCommissionerObject","GetToken()");
  pAVar10 = (ActionInterface<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&()> *
            )operator_new(0x10);
  pAVar10->_vptr_ActionInterface = (_func_int **)&PTR__ActionInterface_0039b950;
  pAVar10[1]._vptr_ActionInterface = (_func_int **)&local_1c8;
  testing::Action<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&()>::Action
            ((Action<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&()> *)
             local_2b0,pAVar10);
  testing::internal::
  TypedExpectation<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&()>::WillOnce
            (pTVar9,(Action<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&()> *)
                    local_2b0);
  if (local_2a0 != (undefined1  [8])0x0) {
    (*(code *)local_2a0)(local_2b0,local_2b0,3);
  }
  local_2b0 = (undefined1  [8])local_2a0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_2b0,"token request 127.0.0.1 2001","");
  ot::commissioner::Interpreter::ParseExpression
            ((Expression *)&local_268,&local_160.mInterpreter,(string *)local_2b0);
  local_2d8._M_allocated_capacity =
       (size_type)
       local_248.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_2e8._8_8_ =
       local_248.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_2e8._M_unused._M_object =
       local_248.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_248.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)local_268.field_2._M_allocated_capacity;
  local_248.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)local_268._M_dataplus._M_p;
  local_248.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_268._M_string_length;
  local_268._M_dataplus._M_p = (pointer)0x0;
  local_268._M_string_length = 0;
  local_268.field_2._M_allocated_capacity = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_2e8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_268);
  if (local_2b0 != (undefined1  [8])local_2a0) {
    operator_delete((void *)local_2b0);
  }
  ot::commissioner::Interpreter::Eval((Value *)local_2b0,&local_160.mInterpreter,&local_248);
  local_218._0_4_ = local_2b0._0_4_;
  std::__cxx11::string::operator=((string *)&local_210,(string *)&local_2a8);
  std::__cxx11::string::operator=((string *)&local_1f0,(string *)&local_288);
  if ((element_type *)local_288._M_p != local_278) {
    operator_delete(local_288._M_p);
  }
  if (local_2a8 != (undefined **)local_298) {
    operator_delete(local_2a8);
  }
  bVar8 = ot::commissioner::Interpreter::Value::HasNoError((Value *)local_218);
  local_2e8._M_pod_data[0] = bVar8;
  local_2e8._8_8_ = (undefined8 *)0x0;
  if (!bVar8) {
    testing::Message::Message((Message *)&local_268);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_2b0,(internal *)&local_2e8,(AssertionResult *)0x2ddeee,"false","true"
               ,in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_2c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
               ,0x4b6,(char *)local_2b0);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_2c8,(Message *)&local_268);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_2c8);
    if (local_2b0 != (undefined1  [8])local_2a0) {
      operator_delete((void *)local_2b0);
    }
    if ((long *)local_268._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_268._M_dataplus._M_p + 8))();
    }
    uVar5 = local_2e8._8_8_;
    if ((undefined8 *)local_2e8._8_8_ != (undefined8 *)0x0) {
      if (*(undefined8 **)local_2e8._8_8_ != (undefined8 *)(local_2e8._8_8_ + 0x10)) {
        operator_delete(*(undefined8 **)local_2e8._8_8_);
      }
      operator_delete((void *)uVar5);
    }
  }
  pFVar1 = &(local_160.mDefaultCommissionerObject.
             super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            gmock10_GetToken_132;
  testing::internal::UntypedFunctionMockerBase::RegisterOwner
            (&pFVar1->super_UntypedFunctionMockerBase,
             local_160.mDefaultCommissionerObject.
             super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  local_2e8._M_unused._0_8_ = (undefined8)pFVar1;
  testing::internal::GetWithoutMatchers();
  pTVar9 = testing::internal::
           MockSpec<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&()>::
           InternalExpectedAt((MockSpec<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&()>
                               *)&local_2e8,
                              "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
                              ,0x4b8,"*ctx.mDefaultCommissionerObject","GetToken()");
  pAVar10 = (ActionInterface<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&()> *
            )operator_new(0x10);
  pAVar10->_vptr_ActionInterface = (_func_int **)&PTR__ActionInterface_0039b950;
  pAVar10[1]._vptr_ActionInterface = (_func_int **)&local_1c8;
  testing::Action<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&()>::Action
            ((Action<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&()> *)
             local_2b0,pAVar10);
  testing::internal::
  TypedExpectation<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&()>::WillOnce
            (pTVar9,(Action<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&()> *)
                    local_2b0);
  if (local_2a0 != (undefined1  [8])0x0) {
    (*(code *)local_2a0)(local_2b0,local_2b0,3);
  }
  local_2b0 = (undefined1  [8])local_2a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2b0,"token print","");
  ot::commissioner::Interpreter::ParseExpression
            ((Expression *)&local_268,&local_160.mInterpreter,(string *)local_2b0);
  local_2d8._M_allocated_capacity =
       (size_type)
       local_248.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_2e8._8_8_ =
       local_248.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_2e8._M_unused._M_object =
       local_248.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_248.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)local_268.field_2._M_allocated_capacity;
  local_248.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)local_268._M_dataplus._M_p;
  local_248.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_268._M_string_length;
  local_268._M_dataplus._M_p = (pointer)0x0;
  local_268._M_string_length = 0;
  local_268.field_2._M_allocated_capacity = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_2e8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_268);
  if (local_2b0 != (undefined1  [8])local_2a0) {
    operator_delete((void *)local_2b0);
  }
  ot::commissioner::Interpreter::Eval((Value *)local_2b0,&local_160.mInterpreter,&local_248);
  local_218._0_4_ = local_2b0._0_4_;
  std::__cxx11::string::operator=((string *)&local_210,(string *)&local_2a8);
  std::__cxx11::string::operator=((string *)&local_1f0,(string *)&local_288);
  if ((element_type *)local_288._M_p != local_278) {
    operator_delete(local_288._M_p);
  }
  if (local_2a8 != (undefined **)local_298) {
    operator_delete(local_2a8);
  }
  bVar8 = ot::commissioner::Interpreter::Value::HasNoError((Value *)local_218);
  local_2e8._M_pod_data[0] = bVar8;
  local_2e8._8_8_ = (undefined8 *)0x0;
  if (!bVar8) {
    testing::Message::Message((Message *)&local_268);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_2b0,(internal *)&local_2e8,(AssertionResult *)0x2ddeee,"false","true"
               ,in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_2c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
               ,0x4bb,(char *)local_2b0);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_2c8,(Message *)&local_268);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_2c8);
    if (local_2b0 != (undefined1  [8])local_2a0) {
      operator_delete((void *)local_2b0);
    }
    if ((long *)local_268._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_268._M_dataplus._M_p + 8))();
    }
    uVar5 = local_2e8._8_8_;
    if ((undefined8 *)local_2e8._8_8_ != (undefined8 *)0x0) {
      if (*(undefined8 **)local_2e8._8_8_ != (undefined8 *)(local_2e8._8_8_ + 0x10)) {
        operator_delete(*(undefined8 **)local_2e8._8_8_);
      }
      operator_delete((void *)uVar5);
    }
  }
  local_2e8._M_unused._M_object = &local_2d8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2e8,"123aef","");
  local_268._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_268,"./tmp/token","");
  ot::commissioner::WriteFile((Error *)local_2b0,(string *)&local_2e8,&local_268);
  local_228[0] = local_2b0._0_4_;
  local_1cc = kNone;
  testing::internal::CmpHelperEQ<ot::commissioner::ErrorCode,ot::commissioner::ErrorCode>
            ((internal *)&local_2c8,"WriteFile(\"123aef\", \"./tmp/token\").GetCode()",
             "ErrorCode::kNone",local_228,&local_1cc);
  if (local_2a8 != (undefined **)local_298) {
    operator_delete(local_2a8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268._M_dataplus._M_p != paVar2) {
    operator_delete(local_268._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2e8._M_unused._0_8_ != &local_2d8) {
    operator_delete(local_2e8._M_unused._M_object);
  }
  if (local_2c8.super_MatcherBase<unsigned_short>._vptr_MatcherBase._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_2b0);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
        local_2c8.super_MatcherBase<unsigned_short>.impl_.
        super___shared_ptr<const_testing::MatcherInterface<const_unsigned_short_&>,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      message = (_func_int **)0x2ff875;
    }
    else {
      message = ((local_2c8.super_MatcherBase<unsigned_short>.impl_.
                  super___shared_ptr<const_testing::MatcherInterface<const_unsigned_short_&>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr)->super_MatcherDescriberInterface)._vptr_MatcherDescriberInterface;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_2e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
               ,0x4bd,(char *)message);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_2e8,(Message *)local_2b0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_2e8);
    if (local_2b0 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_2b0 + 8))();
    }
  }
  peVar6 = local_2c8.super_MatcherBase<unsigned_short>.impl_.
           super___shared_ptr<const_testing::MatcherInterface<const_unsigned_short_&>,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      local_2c8.super_MatcherBase<unsigned_short>.impl_.
      super___shared_ptr<const_testing::MatcherInterface<const_unsigned_short_&>,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    p_Var4 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             ((local_2c8.super_MatcherBase<unsigned_short>.impl_.
               super___shared_ptr<const_testing::MatcherInterface<const_unsigned_short_&>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr)->super_MatcherDescriberInterface)._vptr_MatcherDescriberInterface;
    if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                  ((long)local_2c8.super_MatcherBase<unsigned_short>.impl_.
                         super___shared_ptr<const_testing::MatcherInterface<const_unsigned_short_&>,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr + 0x10)) {
      operator_delete(p_Var4);
    }
    operator_delete(peVar6);
  }
  peVar7 = local_160.mDefaultCommissionerObject.
           super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_268._M_string_length = (size_type)operator_new(8);
  ((__shared_ptr<testing::internal::ExpectationBase,_(__gnu_cxx::_Lock_policy)2> *)
  &((pointer)local_268._M_string_length)->_M_dataplus)->_M_ptr =
       (element_type *)&PTR__MatcherDescriberInterface_0039ba00;
  local_268._M_dataplus._M_p = (pointer)&PTR__MatcherBase_00396668;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<testing::MatcherInterface<std::vector<unsigned_char,std::allocator<unsigned_char>>const&>const*>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_268.field_2._M_allocated_capacity,
             (MatcherInterface<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&> *
             )local_268._M_string_length);
  local_268._M_dataplus._M_p = (pointer)&PTR__MatcherBase_00396620;
  CommissionerAppMock::gmock_SetToken
            ((MockSpec<ot::commissioner::Error_(const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&)>
              *)local_2b0,peVar7,
             (Matcher<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&> *)
             &local_268);
  testing::internal::GetWithoutMatchers();
  this_01 = testing::internal::
            MockSpec<ot::commissioner::Error_(const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&)>
            ::InternalExpectedAt
                      ((MockSpec<ot::commissioner::Error_(const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&)>
                        *)local_2b0,
                       "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
                       ,0x4be,"*ctx.mDefaultCommissionerObject","SetToken(_)");
  paVar2 = &local_1b0.mMessage.field_2;
  local_1b0.mCode = kNone;
  local_1b0.mMessage._M_string_length = 0;
  local_1b0.mMessage.field_2._M_local_buf[0] = '\0';
  local_1b0.mMessage._M_dataplus._M_p = (pointer)paVar2;
  testing::Return<ot::commissioner::Error>((testing *)&local_2c8,&local_1b0);
  testing::internal::ReturnAction::operator_cast_to_Action
            ((Action<ot::commissioner::Error_(const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&)>
              *)&local_2e8,(ReturnAction *)&local_2c8);
  testing::internal::
  TypedExpectation<ot::commissioner::Error_(const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&)>
  ::WillOnce(this_01,(Action<ot::commissioner::Error_(const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&)>
                      *)&local_2e8);
  if ((pointer)local_2d8._M_allocated_capacity != (pointer)0x0) {
    (*(code *)local_2d8._M_allocated_capacity)(&local_2e8,&local_2e8,3);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      local_2c8.super_MatcherBase<unsigned_short>.impl_.
      super___shared_ptr<const_testing::MatcherInterface<const_unsigned_short_&>,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_2c8.super_MatcherBase<unsigned_short>.impl_.
               super___shared_ptr<const_testing::MatcherInterface<const_unsigned_short_&>,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0.mMessage._M_dataplus._M_p != paVar2) {
    operator_delete(local_1b0.mMessage._M_dataplus._M_p);
  }
  local_2a8 = &PTR__MatcherBase_00396668;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_298._0_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_298._0_8_);
  }
  local_268._M_dataplus._M_p = (pointer)&PTR__MatcherBase_00396668;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_268.field_2._M_allocated_capacity !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_268.field_2._M_allocated_capacity);
  }
  testing::internal::UntypedFunctionMockerBase::RegisterOwner
            (&((local_160.mDefaultCommissionerObject.
                super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              gmock10_GetToken_132).super_UntypedFunctionMockerBase,
             local_160.mDefaultCommissionerObject.
             super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  local_2e8._M_unused._0_8_ =
       (undefined8)
       &(local_160.mDefaultCommissionerObject.
         super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
        gmock10_GetToken_132;
  testing::internal::GetWithoutMatchers();
  pTVar9 = testing::internal::
           MockSpec<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&()>::
           InternalExpectedAt((MockSpec<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&()>
                               *)&local_2e8,
                              "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
                              ,0x4bf,"*ctx.mDefaultCommissionerObject","GetToken()");
  pAVar10 = (ActionInterface<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&()> *
            )operator_new(0x10);
  pAVar10->_vptr_ActionInterface = (_func_int **)&PTR__ActionInterface_0039b950;
  pAVar10[1]._vptr_ActionInterface = (_func_int **)&local_1c8;
  testing::Action<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&()>::Action
            ((Action<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&()> *)
             local_2b0,pAVar10);
  testing::internal::
  TypedExpectation<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&()>::WillOnce
            (pTVar9,(Action<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&()> *)
                    local_2b0);
  if (local_2a0 != (undefined1  [8])0x0) {
    (*(code *)local_2a0)(local_2b0,local_2b0,3);
  }
  local_2b0 = (undefined1  [8])local_2a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2b0,"token set ./tmp/token","");
  ot::commissioner::Interpreter::ParseExpression
            ((Expression *)&local_268,&local_160.mInterpreter,(string *)local_2b0);
  local_2d8._M_allocated_capacity =
       (size_type)
       local_248.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_2e8._8_8_ =
       local_248.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_2e8._M_unused._M_object =
       local_248.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_248.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)local_268.field_2._M_allocated_capacity;
  local_248.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)local_268._M_dataplus._M_p;
  local_248.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_268._M_string_length;
  local_268._M_dataplus._M_p = (pointer)0x0;
  local_268._M_string_length = 0;
  local_268.field_2._M_allocated_capacity = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_2e8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_268);
  if (local_2b0 != (undefined1  [8])local_2a0) {
    operator_delete((void *)local_2b0);
  }
  ot::commissioner::Interpreter::Eval((Value *)local_2b0,&local_160.mInterpreter,&local_248);
  local_218._0_4_ = local_2b0._0_4_;
  std::__cxx11::string::operator=((string *)&local_210,(string *)&local_2a8);
  std::__cxx11::string::operator=((string *)&local_1f0,(string *)&local_288);
  if ((element_type *)local_288._M_p != local_278) {
    operator_delete(local_288._M_p);
  }
  if (local_2a8 != (undefined **)local_298) {
    operator_delete(local_2a8);
  }
  bVar8 = ot::commissioner::Interpreter::Value::HasNoError((Value *)local_218);
  local_2e8._M_pod_data[0] = bVar8;
  local_2e8._8_8_ = (undefined8 *)0x0;
  if (!bVar8) {
    testing::Message::Message((Message *)&local_268);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_2b0,(internal *)&local_2e8,(AssertionResult *)0x2ddeee,"false","true"
               ,in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_2c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
               ,0x4c2,(char *)local_2b0);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_2c8,(Message *)&local_268);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_2c8);
    if (local_2b0 != (undefined1  [8])local_2a0) {
      operator_delete((void *)local_2b0);
    }
    if ((long *)local_268._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_268._M_dataplus._M_p + 8))();
    }
    uVar5 = local_2e8._8_8_;
    if ((undefined8 *)local_2e8._8_8_ != (undefined8 *)0x0) {
      if (*(undefined8 **)local_2e8._8_8_ != (undefined8 *)(local_2e8._8_8_ + 0x10)) {
        operator_delete(*(undefined8 **)local_2e8._8_8_);
      }
      operator_delete((void *)uVar5);
    }
  }
  if (local_1c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0._M_p != &local_1e0) {
    operator_delete(local_1f0._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210._M_p != &local_200) {
    operator_delete(local_210._M_p);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_248);
  InterpreterTestSuite::TestContext::~TestContext(&local_160);
  return;
}

Assistant:

TEST_F(InterpreterTestSuite, PC_Token)
{
    TestContext ctx;
    InitContext(ctx);

    Interpreter::Expression expr;
    Interpreter::Value      value;

    const ByteArray token = {'1', '2', '3', 'a', 'e', 'f'};

    EXPECT_CALL(*ctx.mDefaultCommissionerObject, RequestToken(_, _)).WillOnce(Return(Error{}));
    EXPECT_CALL(*ctx.mDefaultCommissionerObject, GetToken()).WillOnce(ReturnRef(token));

    expr  = ctx.mInterpreter.ParseExpression("token request 127.0.0.1 2001");
    value = ctx.mInterpreter.Eval(expr);
    EXPECT_TRUE(value.HasNoError());

    EXPECT_CALL(*ctx.mDefaultCommissionerObject, GetToken()).WillOnce(ReturnRef(token));
    expr  = ctx.mInterpreter.ParseExpression("token print");
    value = ctx.mInterpreter.Eval(expr);
    EXPECT_TRUE(value.HasNoError());

    EXPECT_EQ(WriteFile("123aef", "./tmp/token").GetCode(), ErrorCode::kNone);
    EXPECT_CALL(*ctx.mDefaultCommissionerObject, SetToken(_)).WillOnce(Return(Error{}));
    EXPECT_CALL(*ctx.mDefaultCommissionerObject, GetToken()).WillOnce(ReturnRef(token));
    expr  = ctx.mInterpreter.ParseExpression("token set ./tmp/token");
    value = ctx.mInterpreter.Eval(expr);
    EXPECT_TRUE(value.HasNoError());
}